

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

ModelPtr __thiscall libcellml::Importer::flattenModel(Importer *this,ModelPtr *model)

{
  pointer *ppuVar1;
  Model *this_00;
  ComponentEntity *this_01;
  IssueImpl *pIVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  LoggerImpl *pLVar6;
  ImporterImpl *this_02;
  UnitsPtr *pUVar7;
  size_t sVar8;
  int in_ECX;
  ModelPtr *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  void *__child_stack;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  ComponentPtr *in_R8;
  size_t index_1;
  ulong componentIndex;
  size_t index;
  UnitsPtr *units;
  ModelPtr MVar10;
  IssuePtr issue;
  UnitsPtr u;
  ComponentEntityPtr local_68;
  string local_58;
  
  pLVar6 = Logger::pFunc((Logger *)model);
  Logger::LoggerImpl::removeAllIssues(pLVar6);
  (this->super_Logger)._vptr_Logger = (_func_int **)0x0;
  (this->super_Logger).mPimpl = (LoggerImpl *)0x0;
  if ((in_RDX->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((IssueImpl *)
               ((local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
               INVALID_ARGUMENT);
    pIVar2 = (IssueImpl *)
             ((local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"The model is null.","");
    Issue::IssueImpl::setDescription(pIVar2,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    pLVar6 = Logger::pFunc((Logger *)model);
    Logger::LoggerImpl::addIssue(pLVar6,(IssuePtr *)&local_68);
    _Var9._M_pi = extraout_RDX_00;
  }
  else {
    this_02 = (ImporterImpl *)Logger::pFunc((Logger *)model);
    bVar5 = ImporterImpl::hasImportIssues(this_02,in_RDX);
    _Var9._M_pi = extraout_RDX;
    if (bVar5) goto LAB_00230d27;
    bVar5 = Model::isDefined((in_RDX->
                             super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
    if (bVar5) {
      Model::clone((Model *)&local_58,
                   (__fn *)(in_RDX->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,__child_stack,in_ECX,in_R8);
      sVar4 = local_58._M_string_length;
      _Var3._M_p = local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      pLVar6 = (this->super_Logger).mPimpl;
      (this->super_Logger)._vptr_Logger = (_func_int **)_Var3._M_p;
      (this->super_Logger).mPimpl = (LoggerImpl *)sVar4;
      if (pLVar6 != (LoggerImpl *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pLVar6);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      while( true ) {
        this_00 = (Model *)(this->super_Logger)._vptr_Logger;
        bVar5 = Model::hasImports(this_00);
        if (!bVar5) break;
        units = (UnitsPtr *)0x0;
        while( true ) {
          pUVar7 = (UnitsPtr *)Model::unitsCount(this_00);
          if (pUVar7 <= units) break;
          Model::units((Model *)&local_58,(size_t)this_00);
          bVar5 = ImportedEntity::isImport((ImportedEntity *)(local_58._M_dataplus._M_p + 0x10));
          if (bVar5) {
            local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (ComponentEntity *)0x0;
            local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            flattenUnitsImports((libcellml *)this,(ModelPtr *)&local_58,units,(size_t)&local_68,
                                in_R8);
            if ((LoggerImpl *)
                local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (LoggerImpl *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_68.
                         super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
          }
          units = (UnitsPtr *)
                  ((long)&(units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + 1);
        }
        componentIndex = 0;
        while( true ) {
          this_01 = (ComponentEntity *)(this->super_Logger)._vptr_Logger;
          sVar8 = ComponentEntity::componentCount(this_01);
          if (sVar8 <= componentIndex) break;
          ComponentEntity::component((ComponentEntity *)&local_58,(size_t)this_01);
          local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->super_Logger).mPimpl;
          if ((LoggerImpl *)
              local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (LoggerImpl *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ppuVar1 = &(((LoggerImpl *)
                          local_68.
                          super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->mErrors).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
              UNLOCK();
            }
            else {
              ppuVar1 = &(((LoggerImpl *)
                          local_68.
                          super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->mErrors).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *(int *)ppuVar1 = *(int *)ppuVar1 + 1;
            }
          }
          local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = this_01;
          flattenComponentImports(&local_68,(ComponentPtr *)&local_58,componentIndex);
          if ((LoggerImpl *)
              local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (LoggerImpl *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_68.
                       super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
          }
          componentIndex = componentIndex + 1;
        }
      }
      Model::linkUnits(this_00);
      _Var9._M_pi = extraout_RDX_03;
      goto LAB_00230d27;
    }
    Issue::IssueImpl::create();
    Issue::IssueImpl::setReferenceRule
              ((IssueImpl *)
               ((local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl,
               IMPORTER_UNDEFINED_MODEL);
    pIVar2 = (IssueImpl *)
             ((local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"The model is not fully defined.","");
    Issue::IssueImpl::setDescription(pIVar2,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    pLVar6 = Logger::pFunc((Logger *)model);
    Logger::LoggerImpl::addIssue(pLVar6,(IssuePtr *)&local_68);
    _Var9._M_pi = extraout_RDX_01;
  }
  if ((LoggerImpl *)
      local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (LoggerImpl *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var9._M_pi = extraout_RDX_02;
  }
LAB_00230d27:
  MVar10.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  MVar10.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ModelPtr)MVar10.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ModelPtr Importer::flattenModel(const ModelPtr &model)
{
    pFunc()->removeAllIssues();
    ModelPtr flatModel;
    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::INVALID_ARGUMENT);
        issue->mPimpl->setDescription("The model is null.");
        pFunc()->addIssue(issue);

        return flatModel;
    }

    if (pFunc()->hasImportIssues(model)) {
        return flatModel;
    }

    if (!model->isDefined()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_UNDEFINED_MODEL);
        issue->mPimpl->setDescription("The model is not fully defined.");
        pFunc()->addIssue(issue);

        return flatModel;
    }

    flatModel = model->clone();

    while (flatModel->hasImports()) {
        // Go through Units and instantiate any imported Units.
        for (size_t index = 0; index < flatModel->unitsCount(); ++index) {
            auto u = flatModel->units(index);
            if (u->isImport()) {
                flattenUnitsImports(flatModel, u, index, nullptr);
            }
        }

        // Go through Components and instantiate any imported Components.
        for (size_t index = 0; index < flatModel->componentCount(); ++index) {
            auto c = flatModel->component(index);
            flattenComponentImports(flatModel, c, index);
        }
    }

    flatModel->linkUnits();

    return flatModel;
}